

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristics.cpp
# Opt level: O2

bool __thiscall
Clasp::ClaspVmtf::bump(ClaspVmtf *this,Solver *param_1,WeightLitVec *lits,double adj)

{
  int iVar1;
  uint32 *puVar2;
  pointer ppVar3;
  long lVar4;
  
  ppVar3 = (lits->ebo_).buf;
  for (lVar4 = (ulong)(lits->ebo_).size << 3; lVar4 != 0; lVar4 = lVar4 + -8) {
    iVar1 = ppVar3->second;
    puVar2 = VarInfo::activity((this->score_).ebo_.buf + ((ppVar3->first).rep_ >> 2),this->decay_);
    *puVar2 = *puVar2 + (int)(long)((double)iVar1 * adj);
    ppVar3 = ppVar3 + 1;
  }
  return true;
}

Assistant:

bool ClaspVmtf::bump(const Solver&, const WeightLitVec& lits, double adj) {
	for (WeightLitVec::const_iterator it = lits.begin(), end = lits.end(); it != end; ++it) {
		score_[it->first.var()].activity(decay_) += static_cast<uint32>(it->second*adj);
	}
	return true;
}